

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_tree(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  xmlNodePtr pxVar12;
  xmlNodePtr pxVar13;
  xmlBufferPtr pxVar14;
  xmlDocPtr pxVar15;
  xmlAttrPtr pxVar16;
  xmlChar *pxVar17;
  long lVar18;
  undefined8 uVar19;
  ulong uVar20;
  xmlDocPtr pxVar21;
  xmlDocPtr pxVar22;
  xmlDocPtr pxVar23;
  xmlDocPtr pxVar24;
  FILE *pFVar25;
  xmlNsPtr pxVar26;
  xmlDocPtr pxVar27;
  xmlChar *pxVar28;
  xmlOutputBufferPtr pxVar29;
  char *pcVar30;
  undefined8 uVar31;
  int nr;
  int nr_00;
  int nr_01;
  int nr_02;
  int nr_03;
  int extraout_EDX;
  int extraout_EDX_00;
  int nr_04;
  int nr_05;
  int nr_06;
  int nr_07;
  int nr_08;
  int nr_09;
  int nr_10;
  int nr_11;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int nr_12;
  int nr_13;
  int nr_14;
  int nr_15;
  int nr_16;
  int nr_17;
  int nr_18;
  int nr_19;
  int nr_20;
  int nr_21;
  int nr_22;
  int nr_23;
  int nr_24;
  int nr_25;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int nr_26;
  int nr_27;
  int nr_28;
  int nr_29;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int nr_30;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int nr_31;
  int nr_32;
  int nr_33;
  int nr_34;
  int nr_35;
  int nr_36;
  int nr_37;
  int nr_38;
  int nr_39;
  int nr_40;
  int nr_41;
  int nr_42;
  int nr_43;
  int nr_44;
  int nr_45;
  int extraout_EDX_09;
  int nr_46;
  int nr_47;
  int nr_48;
  int nr_49;
  int nr_50;
  int nr_51;
  int nr_52;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int nr_53;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int nr_54;
  int extraout_EDX_14;
  int nr_55;
  int nr_56;
  int nr_57;
  int nr_58;
  int nr_59;
  int nr_60;
  int nr_61;
  int nr_62;
  int nr_63;
  int nr_64;
  int nr_65;
  int nr_66;
  int nr_67;
  int nr_68;
  int nr_69;
  int nr_70;
  int nr_71;
  int nr_72;
  int nr_73;
  int nr_74;
  int nr_75;
  int nr_76;
  int nr_77;
  int nr_78;
  int nr_79;
  int nr_80;
  bool bVar32;
  int test_ret_10;
  int test_ret_1;
  xmlDocPtr in_RSI;
  undefined4 uVar33;
  ulong uVar34;
  int n_doc_1;
  int test_ret_2;
  uint no;
  undefined8 *puVar35;
  uint *puVar36;
  int n_parent;
  uint uVar37;
  undefined1 auVar38 [12];
  undefined1 auVar39 [16];
  int test_ret_12;
  int test_ret_3;
  int test_ret_9;
  int local_d0;
  uint local_cc;
  uint local_c8;
  int test_ret_8;
  int test_ret;
  int test_ret_19;
  int local_b0;
  int test_ret_18;
  int local_a8;
  int test_ret_16;
  int local_a0;
  int local_9c;
  int test_ret_7;
  int local_94;
  int local_90;
  int local_8c;
  int test_ret_6;
  int test_ret_26;
  int test_ret_5;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int test_ret_17;
  int local_58;
  int local_54;
  int test_ret_15;
  int test_ret_23;
  int test_ret_22;
  int local_44;
  int local_40;
  int test_ret_20;
  int test_ret_21;
  int local_34;
  
  if (quiet == '\0') {
    puts("Testing tree : 146 of 172 functions ...");
  }
  iVar6 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 3) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
      pxVar12 = gen_xmlNodePtr_in(iVar7,iVar2);
      pxVar13 = (xmlNodePtr)xmlAddChild(in_RSI,pxVar12);
      if (pxVar13 == (xmlNodePtr)0x0) {
        xmlFreeNode(pxVar12);
      }
      desret_xmlNodePtr(pxVar13);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChild",(ulong)(uint)(iVar2 - iVar1));
        iVar6 = iVar6 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_cc = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 3) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
      pxVar12 = gen_xmlNodePtr_in(iVar7,iVar2);
      pxVar13 = (xmlNodePtr)xmlAddChildList(in_RSI,pxVar12);
      if (pxVar13 == (xmlNodePtr)0x0) {
        xmlFreeNodeList(pxVar12);
      }
      desret_xmlNodePtr(pxVar13);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddChildList",(ulong)(uint)(iVar2 - iVar1));
        local_cc = local_cc + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_c8 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 3) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
      pxVar12 = gen_xmlNodePtr_in(iVar7,iVar2);
      pxVar13 = (xmlNodePtr)xmlAddNextSibling(in_RSI,pxVar12);
      if (pxVar13 == (xmlNodePtr)0x0) {
        xmlFreeNode(pxVar12);
      }
      desret_xmlNodePtr(pxVar13);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_01);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddNextSibling",(ulong)(uint)(iVar2 - iVar1));
        local_c8 = local_c8 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_8 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 3) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
      pxVar12 = gen_xmlNodePtr_in(iVar7,iVar2);
      pxVar13 = (xmlNodePtr)xmlAddPrevSibling(in_RSI,pxVar12);
      if (pxVar13 == (xmlNodePtr)0x0) {
        xmlFreeNode(pxVar12);
      }
      desret_xmlNodePtr(pxVar13);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_02);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddPrevSibling",(ulong)(uint)(iVar2 - iVar1));
        test_ret_8 = test_ret_8 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_d0 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 3) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
      pxVar12 = gen_xmlNodePtr_in(iVar7,iVar2);
      pxVar13 = (xmlNodePtr)xmlAddSibling(in_RSI,pxVar12);
      if (pxVar13 == (xmlNodePtr)0x0) {
        xmlFreeNode(pxVar12);
      }
      desret_xmlNodePtr(pxVar13);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_03);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlAddSibling",(ulong)(uint)(iVar2 - iVar1));
        local_d0 = local_d0 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
    uVar20 = 0;
    while (iVar2 = (int)uVar20, iVar2 != 4) {
      for (iVar5 = 0; iVar5 != 2; iVar5 = iVar5 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while (iVar8 = (int)pxVar27, iVar8 != 5) {
          iVar3 = xmlMemBlocks();
          iVar4 = (int)in_RSI;
          pxVar14 = gen_xmlBufferPtr(iVar1,iVar4);
          pxVar15 = gen_xmlDocPtr(iVar2,iVar4);
          pxVar16 = gen_xmlAttrPtr(iVar5,iVar4);
          pxVar17 = gen_const_xmlChar_ptr(iVar8,iVar4);
          in_RSI = pxVar15;
          xmlAttrSerializeTxtContent(pxVar14,pxVar15,pxVar16,pxVar17);
          call_tests = call_tests + 1;
          iVar4 = extraout_EDX;
          if (pxVar14 != (xmlBufferPtr)0x0) {
            xmlBufferFree(pxVar14);
            iVar4 = extraout_EDX_00;
          }
          des_xmlDocPtr((int)pxVar15,in_RSI,iVar4);
          if (iVar5 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlAttrSerializeTxtContent",
                   (ulong)(uint)(iVar4 - iVar3));
            iVar7 = iVar7 + 1;
            printf(" %d",iVar1);
            printf(" %d",uVar20);
            printf(" %d",iVar5);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar8 + 1);
        }
      }
      uVar20 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_d0 = -(local_d0 + iVar7 + local_c8 + test_ret_8 + iVar6 + local_cc);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    lVar18 = xmlBufContent(0);
    if (lVar18 != 0) {
      (*_xmlFree)(lVar18);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlBufContent");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    lVar18 = xmlBufEnd(0);
    if (lVar18 != 0) {
      (*_xmlFree)(lVar18);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlBufEnd");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  bVar32 = true;
LAB_0012bd04:
  if (bVar32) {
    bVar32 = true;
    while (bVar32) {
      iVar7 = xmlMemBlocks();
      bVar32 = false;
      in_RSI = (xmlDocPtr)0x0;
      xmlBufGetNodeContent();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 == iVar1) goto LAB_0012bd04;
      xmlMemBlocks();
      bVar32 = false;
      printf("Leak of %d blocks found in xmlBufGetNodeContent");
      iVar6 = iVar6 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar32 = false;
    goto LAB_0012bd04;
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (iVar1 = 0; iVar1 != 3; iVar1 = iVar1 + 1) {
    uVar20 = 0;
    while (iVar2 = (int)uVar20, iVar2 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar5 = (int)pxVar27, iVar5 != 4) {
        iVar8 = xmlMemBlocks();
        iVar4 = (int)in_RSI;
        pxVar14 = gen_xmlBufferPtr(iVar1,iVar4);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar4);
        iVar4 = gen_int(iVar5,iVar4);
        if ((in_RSI != (xmlDocPtr)0x0) && (iVar3 = xmlStrlen(in_RSI), iVar3 < iVar4)) {
          iVar4 = 0;
        }
        xmlBufferAdd(pxVar14,in_RSI,iVar4);
        call_tests = call_tests + 1;
        if (pxVar14 != (xmlBufferPtr)0x0) {
          xmlBufferFree();
        }
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar8 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAdd",(ulong)(uint)(iVar4 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d",iVar1);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
      }
      uVar20 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    uVar20 = 0;
    while (iVar5 = (int)uVar20, iVar5 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar8 = (int)pxVar27, iVar8 != 4) {
        iVar4 = xmlMemBlocks();
        iVar3 = (int)in_RSI;
        pxVar14 = gen_xmlBufferPtr(iVar2,iVar3);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,iVar3);
        iVar3 = gen_int(iVar8,iVar3);
        if ((in_RSI != (xmlDocPtr)0x0) && (iVar9 = xmlStrlen(in_RSI), iVar9 < iVar3)) {
          iVar3 = 0;
        }
        xmlBufferAddHead(pxVar14,in_RSI,iVar3);
        call_tests = call_tests + 1;
        if (pxVar14 != (xmlBufferPtr)0x0) {
          xmlBufferFree();
        }
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar4 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlBufferAddHead",(ulong)(uint)(iVar3 - iVar4));
          iVar1 = iVar1 + 1;
          printf(" %d",iVar2);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar8 + 1);
      }
      uVar20 = (ulong)(iVar5 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    puVar35 = &DAT_0015bd68;
    pxVar27 = (xmlDocPtr)0x0;
    while (uVar10 = (uint)pxVar27, uVar10 != 4) {
      iVar5 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
      if (uVar10 < 3) {
        in_RSI = (xmlDocPtr)*puVar35;
      }
      else {
        in_RSI = (xmlDocPtr)0x0;
      }
      xmlBufferCCat();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar5 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCCat",(ulong)(uint)(iVar8 - iVar5));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      puVar35 = puVar35 + 1;
      pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar20 = 0;
  while (iVar8 = (int)uVar20, iVar8 != 3) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar27, iVar4 != 5) {
      iVar3 = xmlMemBlocks();
      iVar9 = (int)in_RSI;
      pxVar14 = gen_xmlBufferPtr(iVar8,iVar9);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar4,iVar9);
      xmlBufferCat();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar3 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferCat",(ulong)(uint)(iVar9 - iVar3));
        iVar5 = iVar5 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
    uVar20 = (ulong)(iVar8 + 1);
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 - (iVar1 + iVar2 + iVar6 + iVar7 + iVar5);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlBufferContent(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlBufferContent");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  iVar6 = xmlMemBlocks();
  uVar19 = xmlBufferCreate();
  xmlBufferFree(uVar19);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar7 = xmlMemBlocks();
  if (iVar6 != iVar7) {
    iVar1 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar1 - iVar6);
    printf("Leak of %d blocks found in xmlBufferCreate");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
    lVar18 = xmlBufferDetach();
    if (lVar18 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    if (pxVar14 != (xmlBufferPtr)0x0) {
      xmlBufferFree();
    }
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar2 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferDetach",(ulong)(uint)(iVar5 - iVar2));
      iVar1 = iVar1 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar5 = xmlMemBlocks();
    pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
    xmlBufferEmpty();
    call_tests = call_tests + 1;
    if (pxVar14 != (xmlBufferPtr)0x0) {
      xmlBufferFree();
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlBufferEmpty",(ulong)(uint)(iVar8 - iVar5));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  uVar20 = 0;
  while (iVar8 = (int)uVar20, iVar8 != 3) {
    puVar36 = &DAT_0014b074;
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar4 = (int)pxVar27, iVar4 != 3) {
      iVar3 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(iVar8,(int)in_RSI);
      in_RSI = (xmlDocPtr)(ulong)*puVar36;
      xmlBufferGrow();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar3 != iVar9) {
        iVar9 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferGrow",(ulong)(uint)(iVar9 - iVar3));
        iVar5 = iVar5 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      puVar36 = puVar36 + 1;
      pxVar27 = (xmlDocPtr)(ulong)(iVar4 + 1);
    }
    uVar20 = (ulong)(iVar8 + 1);
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 - (iVar2 + iVar5 + (uint)(iVar6 != iVar7) + iVar1);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlBufferLength(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlBufferLength");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    puVar36 = &DAT_0014b074;
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 3) {
      iVar7 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
      in_RSI = (xmlDocPtr)(ulong)*puVar36;
      xmlBufferResize();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferResize",(ulong)(uint)(iVar1 - iVar7));
        local_74 = local_74 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      puVar36 = puVar36 + 1;
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0xffffffffffffffff;
    while (uVar10 = (uint)pxVar27, uVar10 != 3) {
      iVar6 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
      in_RSI = (xmlDocPtr)0x0;
      if (uVar10 < 3) {
        in_RSI = (xmlDocPtr)(ulong)*(uint *)(&DAT_0014b080 + ((ulong)pxVar27 & 0xffffffff) * 4);
      }
      xmlBufferSetAllocationScheme();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferSetAllocationScheme",
               (ulong)(uint)(iVar7 - iVar6));
        local_78 = local_78 + 1;
        printf(" %d",(ulong)uVar37);
        in_RSI = pxVar27;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    puVar36 = &DAT_0014b074;
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 3) {
      iVar7 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
      in_RSI = (xmlDocPtr)(ulong)*puVar36;
      xmlBufferShrink();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferShrink",(ulong)(uint)(iVar1 - iVar7));
        local_7c = local_7c + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      puVar36 = puVar36 + 1;
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 5) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar14 = gen_xmlBufferPtr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar1);
      xmlBufferWriteCHAR();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteCHAR",(ulong)(uint)(iVar1 - iVar7));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_26 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    puVar35 = &DAT_0015bd68;
    pxVar27 = (xmlDocPtr)0x0;
    while (uVar10 = (uint)pxVar27, uVar10 != 4) {
      iVar6 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(uVar37,(int)in_RSI);
      if (uVar10 < 3) {
        in_RSI = (xmlDocPtr)*puVar35;
      }
      else {
        in_RSI = (xmlDocPtr)0x0;
      }
      xmlBufferWriteChar();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar6 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteChar",(ulong)(uint)(iVar7 - iVar6));
        test_ret_26 = test_ret_26 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      puVar35 = puVar35 + 1;
      pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_6 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 5) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar14 = gen_xmlBufferPtr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar1);
      xmlBufferWriteQuotedString();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBufferWriteQuotedString",(ulong)(uint)(iVar1 - iVar7))
        ;
        test_ret_6 = test_ret_6 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (iVar6 = 0; iVar6 != 5; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
      uVar20 = 0;
      while (iVar1 = (int)uVar20, iVar1 != 2) {
        pxVar27 = (xmlDocPtr)0x0;
        pxVar17 = (xmlChar *)0x0;
        if (iVar1 == 0) {
          pxVar17 = chartab;
        }
        while (iVar2 = (int)pxVar27, iVar2 != 4) {
          iVar5 = xmlMemBlocks();
          iVar8 = (int)in_RSI;
          pxVar15 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar8);
          pxVar21 = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar8);
          gen_int(iVar2,iVar8);
          if (pxVar21 != (xmlDocPtr)0x0) {
            xmlStrlen(pxVar21);
          }
          in_RSI = pxVar21;
          pxVar22 = (xmlDocPtr)xmlBuildQName(pxVar15,pxVar21,pxVar17);
          if ((((pxVar22 != (xmlDocPtr)pxVar17) && (pxVar22 != pxVar21)) &&
              (pxVar22 != (xmlDocPtr)0x0)) && (pxVar22 != pxVar15)) {
            (*_xmlFree)();
          }
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar5 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlBuildQName",(ulong)(uint)(iVar8 - iVar5));
            local_68 = local_68 + 1;
            printf(" %d",iVar6);
            printf(" %d",iVar7);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        uVar20 = (ulong)(iVar1 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_16 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,(int)in_RSI);
    xmlChildElementCount(in_RSI);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_04);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlChildElementCount",(ulong)(uint)(iVar7 - iVar6));
      test_ret_16 = test_ret_16 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 4) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar15 = gen_xmlDocPtr(uVar37,iVar1);
      uVar10 = gen_int(iVar6,iVar1);
      in_RSI = (xmlDocPtr)(ulong)uVar10;
      pxVar21 = (xmlDocPtr)xmlCopyDoc(pxVar15);
      desret_xmlDocPtr(pxVar21);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_05);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyDoc",(ulong)(uint)(iVar1 - iVar7));
        local_8c = local_8c + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_a8 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlDtdPtr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlCopyDtd(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlDtdPtr(uVar37,(xmlDtdPtr)in_RSI,nr_06);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyDtd",(ulong)(uint)(iVar7 - iVar6));
      local_a8 = local_a8 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_18 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    gen_xmlNsPtr(uVar37,(int)in_RSI);
    lVar18 = xmlCopyNamespace();
    if (lVar18 != 0) {
      xmlFreeNs();
    }
    call_tests = call_tests + 1;
    if (uVar37 == 0) {
      free_api_doc();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespace",(ulong)(uint)(iVar7 - iVar6));
      test_ret_18 = test_ret_18 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_b0 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    gen_xmlNsPtr(uVar37,(int)in_RSI);
    lVar18 = xmlCopyNamespaceList();
    if (lVar18 != 0) {
      xmlFreeNsList();
    }
    call_tests = call_tests + 1;
    if (uVar37 == 0) {
      free_api_doc();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNamespaceList",(ulong)(uint)(iVar7 - iVar6));
      local_b0 = local_b0 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_90 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 4) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
      iVar1 = gen_int(iVar6,iVar1);
      pxVar12 = (xmlNodePtr)xmlCopyNode(in_RSI,iVar1);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_07);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyNode",(ulong)(uint)(iVar1 - iVar7));
        local_90 = local_90 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_19 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlCopyNodeList(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_08);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCopyNodeList",(ulong)(uint)(iVar7 - iVar6));
      test_ret_19 = test_ret_19 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 2) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
      pxVar16 = gen_xmlAttrPtr(iVar6,iVar1);
      pxVar16 = (xmlAttrPtr)xmlCopyProp(in_RSI,pxVar16);
      desret_xmlAttrPtr(pxVar16);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_09);
      if (iVar6 == 0) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyProp",(ulong)(uint)(iVar1 - iVar7));
        local_94 = local_94 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_7 = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 3) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 2) {
      iVar1 = xmlMemBlocks();
      iVar2 = (int)in_RSI;
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar2);
      pxVar16 = gen_xmlAttrPtr(iVar7,iVar2);
      pxVar16 = (xmlAttrPtr)xmlCopyPropList(in_RSI,pxVar16);
      desret_xmlAttrPtr(pxVar16);
      call_tests = call_tests + 1;
      des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_10);
      if (iVar7 == 0) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlCopyPropList",(ulong)(uint)(iVar2 - iVar1));
        test_ret_7 = test_ret_7 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 4) {
    for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
      for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while (iVar7 = (int)pxVar27, iVar7 != 5) {
          iVar1 = xmlMemBlocks();
          iVar2 = (int)in_RSI;
          pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
          in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar37,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(uVar10,iVar2);
          gen_const_xmlChar_ptr(iVar7,iVar2);
          pxVar12 = (xmlNodePtr)xmlCreateIntSubset(pxVar15,in_RSI,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_11);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlCreateIntSubset",(ulong)(uint)(iVar2 - iVar1));
            local_6c = local_6c + 1;
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar37);
            printf(" %d",(ulong)uVar10);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
        }
      }
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  iVar6 = 1;
  local_64 = 0;
  while (iVar6 != 0) {
    for (uVar37 = 0; iVar6 = 0, uVar37 != 4; uVar37 = uVar37 + 1) {
      for (; iVar6 != 3; iVar6 = iVar6 + 1) {
        for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
          for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
            pxVar27 = (xmlDocPtr)0x0;
            while (iVar1 = (int)pxVar27, iVar1 != 4) {
              iVar5 = xmlMemBlocks();
              iVar2 = (int)in_RSI;
              pxVar22 = gen_xmlDocPtr(uVar37,iVar2);
              pxVar23 = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar2);
              pxVar24 = gen_xmlDocPtr(uVar10,iVar2);
              in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar2);
              gen_int(iVar1,iVar2);
              pxVar15 = pxVar22;
              xmlDOMWrapAdoptNode(0,pxVar22,pxVar23,pxVar24,in_RSI);
              pxVar21 = (xmlDocPtr)0x0;
              iVar2 = extraout_EDX_01;
              if ((pxVar23 != (xmlDocPtr)0x0) &&
                 (pxVar21 = pxVar23, pxVar23->parent == (_xmlNode *)0x0)) {
                xmlUnlinkNode(pxVar23);
                xmlFreeNode(pxVar23);
                pxVar21 = (xmlDocPtr)0x0;
                iVar2 = extraout_EDX_02;
              }
              call_tests = call_tests + 1;
              des_xmlDocPtr((int)pxVar22,pxVar15,iVar2);
              des_xmlNodePtr(iVar6,(xmlNodePtr)pxVar21,nr_12);
              des_xmlDocPtr((int)pxVar24,pxVar21,nr_13);
              des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_14);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar5 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlDOMWrapAdoptNode",(ulong)(uint)(iVar2 - iVar5)
                      );
                local_64 = local_64 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar37);
                printf(" %d",iVar6);
                printf(" %d",(ulong)uVar10);
                printf(" %d",iVar7);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar27;
              }
              pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  uVar37 = 1;
  local_60 = 0;
  while (test_ret_3._0_1_ = (char)uVar37, (char)test_ret_3 != '\0') {
    for (uVar10 = 0; uVar37 = 0, uVar10 != 4; uVar10 = uVar10 + 1) {
      for (; uVar37 != 3; uVar37 = uVar37 + 1) {
        uVar11 = 1;
        while (test_ret_12._0_1_ = (char)uVar11, (char)test_ret_12 != '\0') {
          for (local_c8 = 0; uVar11 = 0, local_c8 != 4; local_c8 = local_c8 + 1) {
            for (; uVar11 != 3; uVar11 = uVar11 + 1) {
              for (local_cc = 0; local_cc != 4; local_cc = local_cc + 1) {
                for (no = 0; no != 4; no = no + 1) {
                  iVar6 = xmlMemBlocks();
                  iVar1 = (int)in_RSI;
                  pxVar15 = gen_xmlDocPtr(uVar10,iVar1);
                  pxVar21 = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
                  pxVar22 = gen_xmlDocPtr(local_c8,iVar1);
                  in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar11,iVar1);
                  iVar7 = gen_int(local_cc,iVar1);
                  iVar1 = gen_int(no,iVar1);
                  pxVar27 = pxVar15;
                  xmlDOMWrapCloneNode(0,pxVar15,pxVar21,0,pxVar22,in_RSI,iVar7,iVar1);
                  call_tests = call_tests + 1;
                  des_xmlDocPtr((int)pxVar15,pxVar27,nr_15);
                  des_xmlNodePtr(uVar37,(xmlNodePtr)pxVar21,nr_16);
                  des_xmlDocPtr((int)pxVar22,pxVar21,nr_17);
                  des_xmlNodePtr(uVar11,(xmlNodePtr)in_RSI,nr_18);
                  xmlResetLastError();
                  iVar7 = xmlMemBlocks();
                  if (iVar6 != iVar7) {
                    iVar7 = xmlMemBlocks();
                    printf("Leak of %d blocks found in xmlDOMWrapCloneNode",
                           (ulong)(uint)(iVar7 - iVar6));
                    local_60 = local_60 + 1;
                    printf(" %d",0);
                    printf(" %d",(ulong)uVar10);
                    printf(" %d",(ulong)uVar37);
                    printf(" %d",0);
                    printf(" %d",(ulong)local_c8);
                    printf(" %d",(ulong)uVar11);
                    printf(" %d",(ulong)local_cc);
                    in_RSI = (xmlDocPtr)(ulong)no;
                    printf(" %d");
                    putchar(10);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  pxVar27 = (xmlDocPtr)0x1;
  test_ret_8 = 0;
  while (pxVar27 != (xmlDocPtr)0x0) {
    uVar20 = 0;
    while( true ) {
      pxVar27 = (xmlDocPtr)0x0;
      iVar6 = (int)uVar20;
      if (iVar6 == 3) break;
      while (iVar7 = (int)pxVar27, iVar7 != 4) {
        iVar1 = xmlMemBlocks();
        iVar2 = (int)in_RSI;
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar2);
        iVar2 = gen_int(iVar7,iVar2);
        xmlDOMWrapReconcileNamespaces(0,in_RSI,iVar2);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_19);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDOMWrapReconcileNamespaces",
                 (ulong)(uint)(iVar2 - iVar1));
          test_ret_8 = test_ret_8 + 1;
          printf(" %d",0);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar20 = 1;
  local_cc = 0;
  while (uVar20 != 0) {
    uVar34 = 0;
    while( true ) {
      uVar20 = 0;
      iVar6 = (int)uVar34;
      if (iVar6 == 4) break;
      while (iVar7 = (int)uVar20, iVar7 != 3) {
        pxVar27 = (xmlDocPtr)0x0;
        while (iVar1 = (int)pxVar27, iVar1 != 4) {
          iVar2 = xmlMemBlocks();
          iVar5 = (int)in_RSI;
          pxVar21 = gen_xmlDocPtr(iVar6,iVar5);
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar5);
          gen_int(iVar1,iVar5);
          pxVar15 = pxVar21;
          xmlDOMWrapRemoveNode(0,pxVar21,in_RSI);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar21,pxVar15,nr_20);
          des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_21);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar2 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDOMWrapRemoveNode",(ulong)(uint)(iVar5 - iVar2));
            local_cc = local_cc + 1;
            printf(" %d",0);
            printf(" %d",uVar34);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
        }
        uVar20 = (ulong)(iVar7 + 1);
      }
      uVar34 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 4) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar7 = (int)pxVar27, iVar7 != 4) {
        iVar1 = xmlMemBlocks();
        iVar2 = (int)in_RSI;
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
        pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
        iVar2 = gen_int(iVar7,iVar2);
        pxVar12 = (xmlNodePtr)xmlDocCopyNode(in_RSI,pxVar15,iVar2);
        desret_xmlNodePtr(pxVar12);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_22);
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_23);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocCopyNode",(ulong)(uint)(iVar2 - iVar1));
          local_70 = local_70 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 3) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar21 = gen_xmlDocPtr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar1);
      pxVar15 = in_RSI;
      pxVar12 = (xmlNodePtr)xmlDocCopyNodeList(pxVar21);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar21,pxVar15,nr_24);
      des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_25);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocCopyNodeList",(ulong)(uint)(iVar1 - iVar7));
        local_9c = local_9c + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_a0 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 4) {
      iVar1 = xmlMemBlocks();
      iVar7 = (int)in_RSI;
      pFVar25 = (FILE *)gen_FILE_ptr(uVar37,iVar7);
      pxVar15 = gen_xmlDocPtr(iVar6,iVar7);
      in_RSI = pxVar15;
      xmlDocDump(pFVar25);
      call_tests = call_tests + 1;
      iVar7 = extraout_EDX_03;
      if (pFVar25 != (FILE *)0x0) {
        fclose(pFVar25);
        iVar7 = extraout_EDX_04;
      }
      des_xmlDocPtr((int)pxVar15,in_RSI,iVar7);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar1 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocDump",(ulong)(uint)(iVar7 - iVar1));
        local_a0 = local_a0 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_c8 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x1;
    while (pxVar27 != (xmlDocPtr)0x0) {
      for (iVar6 = 0; pxVar27 = (xmlDocPtr)0x0, iVar6 != 2; iVar6 = iVar6 + 1) {
        uVar19 = 0;
        if (iVar6 == 0) {
          uVar19 = 0x15e438;
        }
        while (iVar7 = (int)pxVar27, iVar7 != 4) {
          iVar1 = xmlMemBlocks();
          iVar2 = (int)in_RSI;
          pxVar15 = gen_xmlDocPtr(uVar37,iVar2);
          gen_int(iVar7,iVar2);
          in_RSI = (xmlDocPtr)0x0;
          xmlDocDumpFormatMemory(pxVar15,0,uVar19);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_26);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpFormatMemory",(ulong)(uint)(iVar2 - iVar1))
            ;
            local_c8 = local_c8 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",0);
            printf(" %d",iVar6);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    uVar20 = 1;
    while (uVar20 != 0) {
      for (iVar7 = 0; uVar20 = 0, iVar7 != 2; iVar7 = iVar7 + 1) {
        uVar19 = 0;
        if (iVar7 == 0) {
          uVar19 = 0x15e438;
        }
        while (uVar10 = (uint)uVar20, uVar10 != 4) {
          pxVar27 = (xmlDocPtr)0x0;
          while (iVar1 = (int)pxVar27, iVar1 != 4) {
            iVar2 = xmlMemBlocks();
            iVar5 = (int)in_RSI;
            pxVar15 = gen_xmlDocPtr(uVar37,iVar5);
            if (uVar10 < 3) {
              uVar31 = (&DAT_0015bd68)[uVar20];
            }
            else {
              uVar31 = 0;
            }
            iVar5 = gen_int(iVar1,iVar5);
            in_RSI = (xmlDocPtr)0x0;
            xmlDocDumpFormatMemoryEnc(pxVar15,0,uVar19,uVar31,iVar5);
            call_tests = call_tests + 1;
            des_xmlDocPtr((int)pxVar15,in_RSI,nr_27);
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar2 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlDocDumpFormatMemoryEnc",
                     (ulong)(uint)(iVar5 - iVar2));
              iVar6 = iVar6 + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",0);
              printf(" %d",iVar7);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar27;
            }
            pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
          }
          uVar20 = (ulong)(uVar10 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    bVar32 = true;
    while (bVar32) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar27, iVar1 != 2) {
        iVar2 = xmlMemBlocks();
        pxVar15 = gen_xmlDocPtr(uVar37,(int)in_RSI);
        uVar19 = 0;
        if (iVar1 == 0) {
          uVar19 = 0x15e438;
        }
        in_RSI = (xmlDocPtr)0x0;
        xmlDocDumpMemory(pxVar15,0,uVar19);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_28);
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocDumpMemory",(ulong)(uint)(iVar5 - iVar2));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      bVar32 = false;
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x1;
    while (pxVar27 != (xmlDocPtr)0x0) {
      for (iVar2 = 0; pxVar27 = (xmlDocPtr)0x0, iVar2 != 2; iVar2 = iVar2 + 1) {
        uVar19 = 0;
        if (iVar2 == 0) {
          uVar19 = 0x15e438;
        }
        puVar35 = &DAT_0015bd68;
        while (uVar10 = (uint)pxVar27, uVar10 != 4) {
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlDocPtr(uVar37,(int)in_RSI);
          if (uVar10 < 3) {
            uVar31 = *puVar35;
          }
          else {
            uVar31 = 0;
          }
          in_RSI = (xmlDocPtr)0x0;
          xmlDocDumpMemoryEnc(pxVar15,0,uVar19,uVar31);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_29);
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar5 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlDocDumpMemoryEnc",(ulong)(uint)(iVar8 - iVar5));
            iVar1 = iVar1 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",0);
            printf(" %d",iVar2);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          puVar35 = puVar35 + 1;
          pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  uVar20 = 0;
  while (iVar5 = (int)uVar20, iVar5 != 2) {
    uVar34 = 0;
    while (iVar8 = (int)uVar34, iVar8 != 4) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar4 = (int)pxVar27, iVar4 != 4) {
        iVar9 = xmlMemBlocks();
        iVar3 = (int)in_RSI;
        pFVar25 = (FILE *)gen_FILE_ptr(iVar5,iVar3);
        pxVar15 = gen_xmlDocPtr(iVar8,iVar3);
        iVar3 = gen_int(iVar4,iVar3);
        in_RSI = pxVar15;
        xmlDocFormatDump(pFVar25,pxVar15,iVar3);
        call_tests = call_tests + 1;
        iVar3 = extraout_EDX_05;
        if (pFVar25 != (FILE *)0x0) {
          fclose(pFVar25);
          iVar3 = extraout_EDX_06;
        }
        des_xmlDocPtr((int)pxVar15,in_RSI,iVar3);
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar9 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlDocFormatDump",(ulong)(uint)(iVar3 - iVar9));
          iVar2 = iVar2 + 1;
          printf(" %d",uVar20);
          printf(" %d",uVar34);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar34 = (ulong)(iVar8 + 1);
    }
    uVar20 = (ulong)(iVar5 + 1);
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 -
             (local_9c + local_a0 + local_c8 + iVar6 + iVar7 + iVar1 + iVar2 +
             local_6c + local_64 + local_60 + test_ret_8 + local_cc + local_70 +
             local_b0 + local_90 + test_ret_19 + local_94 + test_ret_7 +
             test_ret_16 + local_8c + local_a8 + test_ret_18 +
             test_ret_26 + test_ret_6 + local_68 + local_7c + test_ret_5 + local_74 + local_78);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    pxVar12 = (xmlNodePtr)xmlDocGetRootElement(0);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlDocGetRootElement");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  uVar20 = 0;
  while (iVar7 = (int)uVar20, iVar7 != 4) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar1 = (int)pxVar27, iVar1 != 3) {
      iVar2 = xmlMemBlocks();
      iVar5 = (int)in_RSI;
      pxVar15 = gen_xmlDocPtr(iVar7,iVar5);
      pxVar21 = (xmlDocPtr)gen_xmlNodePtr_in(iVar1,iVar5);
      in_RSI = pxVar21;
      pxVar12 = (xmlNodePtr)xmlDocSetRootElement(pxVar15);
      if (pxVar15 == (xmlDocPtr)0x0) {
        xmlFreeNode(pxVar21);
      }
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_30);
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar2 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlDocSetRootElement",(ulong)(uint)(iVar5 - iVar2));
        iVar6 = iVar6 + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    uVar20 = (ulong)(iVar7 + 1);
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar1 = (int)pxVar27, iVar1 != 3) {
        iVar5 = xmlMemBlocks();
        iVar2 = (int)in_RSI;
        pFVar25 = (FILE *)gen_FILE_ptr(uVar37,iVar2);
        pxVar21 = gen_xmlDocPtr(uVar10,iVar2);
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar1,iVar2);
        pxVar15 = pxVar21;
        xmlElemDump(pFVar25,pxVar21,in_RSI);
        call_tests = call_tests + 1;
        iVar2 = extraout_EDX_07;
        if (pFVar25 != (FILE *)0x0) {
          fclose(pFVar25);
          iVar2 = extraout_EDX_08;
        }
        des_xmlDocPtr((int)pxVar21,pxVar15,iVar2);
        des_xmlNodePtr(iVar1,(xmlNodePtr)in_RSI,nr_31);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar5 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlElemDump",(ulong)(uint)(iVar2 - iVar5));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar2 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlFirstElementChild(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_32);
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar2 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlFirstElementChild",(ulong)(uint)(iVar5 - iVar2));
      iVar1 = iVar1 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = xmlMemBlocks();
  xmlGetBufferAllocationScheme();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar5 = xmlMemBlocks();
  if (iVar2 != iVar5) {
    iVar8 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar8 - iVar2);
    printf("Leak of %d blocks found in xmlGetBufferAllocationScheme");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar8 = xmlMemBlocks();
  xmlGetCompressMode();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar4 = xmlMemBlocks();
  if (iVar8 != iVar4) {
    iVar3 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)(ulong)(uint)(iVar3 - iVar8);
    printf("Leak of %d blocks found in xmlGetCompressMode");
    putchar(10);
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 - (iVar6 + iVar7 + iVar1 + (uint)(iVar2 != iVar5) + (uint)(iVar8 != iVar4));
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlGetDocCompressMode(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlGetDocCompressMode");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    pxVar12 = (xmlNodePtr)xmlGetIntSubset(0);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlGetIntSubset");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    pxVar12 = (xmlNodePtr)xmlGetLastChild(0);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlGetLastChild");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlGetLineNo(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlGetLineNo");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  iVar6 = 0;
  while (bVar32) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar7 = (int)pxVar27, iVar7 != 5) {
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,(int)in_RSI);
      lVar18 = xmlGetNoNsProp();
      if (lVar18 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetNoNsProp",(ulong)(uint)(iVar2 - iVar1));
        iVar6 = iVar6 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 - iVar6;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    lVar18 = xmlGetNodePath(0);
    if (lVar18 != 0) {
      (*_xmlFree)(lVar18);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlGetNodePath");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  pxVar27 = (xmlDocPtr)0x1;
  iVar6 = 0;
  while (pxVar27 != (xmlDocPtr)0x0) {
    uVar20 = 0;
    while( true ) {
      pxVar27 = (xmlDocPtr)0x0;
      iVar7 = (int)uVar20;
      if (iVar7 == 5) break;
      while (iVar1 = (int)pxVar27, iVar1 != 5) {
        iVar2 = xmlMemBlocks();
        iVar5 = (int)in_RSI;
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar5);
        pxVar17 = gen_const_xmlChar_ptr(iVar1,iVar5);
        lVar18 = xmlGetNsProp(0,in_RSI,pxVar17);
        if (lVar18 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlGetNsProp",(ulong)(uint)(iVar5 - iVar2));
          iVar6 = iVar6 + 1;
          printf(" %d",0);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  iVar7 = 0;
  while (bVar32) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar1 = (int)pxVar27, iVar1 != 5) {
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar1,(int)in_RSI);
      lVar18 = xmlGetProp();
      if (lVar18 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar2 != iVar5) {
        iVar5 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlGetProp",(ulong)(uint)(iVar5 - iVar2));
        iVar7 = iVar7 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  pxVar27 = (xmlDocPtr)0x1;
  iVar1 = 0;
  while (pxVar27 != (xmlDocPtr)0x0) {
    uVar20 = 0;
    while( true ) {
      pxVar27 = (xmlDocPtr)0x0;
      iVar2 = (int)uVar20;
      if (iVar2 == 5) break;
      while (iVar5 = (int)pxVar27, iVar5 != 5) {
        iVar8 = xmlMemBlocks();
        iVar4 = (int)in_RSI;
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar4);
        pxVar17 = gen_const_xmlChar_ptr(iVar5,iVar4);
        pxVar16 = (xmlAttrPtr)xmlHasNsProp(0,in_RSI,pxVar17);
        desret_xmlAttrPtr(pxVar16);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar8 != iVar4) {
          iVar4 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlHasNsProp",(ulong)(uint)(iVar4 - iVar8));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
      }
      uVar20 = (ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  iVar2 = 0;
  while (bVar32) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar5 = (int)pxVar27, iVar5 != 5) {
      iVar8 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar5,(int)in_RSI);
      pxVar16 = (xmlAttrPtr)xmlHasProp(0);
      desret_xmlAttrPtr(pxVar16);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar8 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlHasProp",(ulong)(uint)(iVar4 - iVar8));
        iVar2 = iVar2 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 - (iVar1 + iVar2 + iVar6 + iVar7);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlIsBlankNode(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlIsBlankNode");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  local_a0 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 5) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      gen_const_xmlChar_ptr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar1);
      xmlIsXHTML();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlIsXHTML",(ulong)(uint)(iVar1 - iVar7));
        local_a0 = local_a0 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_15 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlLastElementChild(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_33);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlLastElementChild",(ulong)(uint)(iVar7 - iVar6));
      test_ret_15 = test_ret_15 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_26 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      while (iVar6 = (int)pxVar27, iVar6 != 4) {
        iVar7 = xmlMemBlocks();
        iVar1 = (int)in_RSI;
        pxVar15 = gen_xmlDocPtr(uVar37,iVar1);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar10,iVar1);
        iVar1 = gen_int(iVar6,iVar1);
        if ((in_RSI != (xmlDocPtr)0x0) && (iVar2 = xmlStrlen(in_RSI), iVar2 < iVar1)) {
          iVar1 = 0;
        }
        pxVar12 = (xmlNodePtr)xmlNewCDataBlock(pxVar15,in_RSI,iVar1);
        desret_xmlNodePtr(pxVar12);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_34);
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar7 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewCDataBlock",(ulong)(uint)(iVar1 - iVar7));
          test_ret_26 = test_ret_26 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_16 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 5) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar15 = gen_xmlDocPtr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar1);
      pxVar12 = (xmlNodePtr)xmlNewCharRef(pxVar15);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_35);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewCharRef",(ulong)(uint)(iVar1 - iVar7));
        test_ret_16 = test_ret_16 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 2) {
      for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
        for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar1 = xmlMemBlocks();
          iVar2 = (int)in_RSI;
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
          pxVar26 = gen_xmlNsPtr(iVar6,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar2);
          gen_const_xmlChar_ptr(uVar10,iVar2);
          pxVar12 = (xmlNodePtr)xmlNewChild(in_RSI,pxVar26,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_36);
          if (iVar6 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewChild",(ulong)(uint)(iVar2 - iVar1));
            local_64 = local_64 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",uVar20);
            printf(" %d",iVar7);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar17 = gen_const_xmlChar_ptr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlNewComment(pxVar17);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewComment",(ulong)(uint)(iVar7 - iVar6));
      local_54 = local_54 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_58 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar17 = gen_const_xmlChar_ptr(uVar37,(int)in_RSI);
    pxVar27 = (xmlDocPtr)xmlNewDoc(pxVar17);
    desret_xmlDocPtr(pxVar27);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDoc",(ulong)(uint)(iVar7 - iVar6));
      local_58 = local_58 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a8 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while (iVar6 = (int)pxVar27, iVar6 != 5) {
      iVar7 = xmlMemBlocks();
      iVar1 = (int)in_RSI;
      pxVar15 = gen_xmlDocPtr(uVar37,iVar1);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar1);
      pxVar12 = (xmlNodePtr)xmlNewDocComment(pxVar15);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_37);
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar7 != iVar1) {
        iVar1 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocComment",(ulong)(uint)(iVar1 - iVar7));
        local_a8 = local_a8 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_17 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar27 = gen_xmlDocPtr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlNewDocFragment(pxVar27);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlDocPtr((int)pxVar27,in_RSI,nr_38);
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewDocFragment",(ulong)(uint)(iVar7 - iVar6));
      test_ret_17 = test_ret_17 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 2) {
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar1 = (int)pxVar27;
          if (iVar1 == 5) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
          in_RSI = (xmlDocPtr)gen_xmlNsPtr(iVar7,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar2);
          gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar12 = (xmlNodePtr)xmlNewDocNode(pxVar15,in_RSI,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_39);
          if (iVar7 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNode",(ulong)(uint)(iVar2 - iVar5));
            local_68 = local_68 + 1;
            printf(" %d",iVar6);
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar37);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
        }
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 2) {
      for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar1 = (int)pxVar27;
          if (iVar1 == 5) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
          in_RSI = (xmlDocPtr)gen_xmlNsPtr(iVar7,iVar2);
          pxVar17 = gen_eaten_name(uVar37,iVar2);
          gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar12 = (xmlNodePtr)xmlNewDocNodeEatName(pxVar15,in_RSI,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_40);
          if (iVar7 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocNodeEatName",(ulong)(uint)(iVar2 - iVar5));
            local_6c = local_6c + 1;
            printf(" %d",iVar6);
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar37);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
        }
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_6 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 5) break;
        iVar2 = xmlMemBlocks();
        pxVar15 = gen_xmlDocPtr(uVar37,iVar7);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(iVar1,iVar7);
        pxVar12 = (xmlNodePtr)xmlNewDocPI(pxVar15,in_RSI,pxVar17);
        desret_xmlNodePtr(pxVar12);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_41);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocPI",(ulong)(uint)(iVar7 - iVar2));
          test_ret_6 = test_ret_6 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 5) break;
        iVar2 = xmlMemBlocks();
        pxVar15 = gen_xmlDocPtr(uVar37,iVar7);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar6,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(iVar1,iVar7);
        pxVar16 = (xmlAttrPtr)xmlNewDocProp(pxVar15,in_RSI,pxVar17);
        desret_xmlAttrPtr(pxVar16);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_42);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocProp",(ulong)(uint)(iVar7 - iVar2));
          local_8c = local_8c + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 2) {
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar1 = (int)pxVar27;
          if (iVar1 == 5) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
          in_RSI = (xmlDocPtr)gen_xmlNsPtr(iVar7,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar2);
          gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar12 = (xmlNodePtr)xmlNewDocRawNode(pxVar15,in_RSI,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_43);
          if (iVar7 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDocRawNode",(ulong)(uint)(iVar2 - iVar5));
            local_70 = local_70 + 1;
            printf(" %d",iVar6);
            printf(" %d",uVar20);
            printf(" %d",(ulong)uVar37);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
        }
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  test_ret_18 = 0;
  while (bVar32) {
    for (uVar37 = 0; iVar6 = (int)in_RSI, uVar37 != 5; uVar37 = uVar37 + 1) {
      iVar7 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar37,iVar6);
      pxVar12 = (xmlNodePtr)xmlNewDocText(0);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar7 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewDocText",(ulong)(uint)(iVar6 - iVar7));
        test_ret_18 = test_ret_18 + 1;
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar37;
        printf(" %d");
        putchar(10);
      }
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  local_90 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar6 = (int)in_RSI;
        iVar7 = (int)pxVar27;
        if (iVar7 == 4) break;
        iVar1 = xmlMemBlocks();
        pxVar15 = gen_xmlDocPtr(uVar37,iVar6);
        in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar10,iVar6);
        iVar6 = gen_int(iVar7,iVar6);
        if ((in_RSI != (xmlDocPtr)0x0) && (iVar2 = xmlStrlen(in_RSI), iVar2 < iVar6)) {
          iVar6 = 0;
        }
        pxVar12 = (xmlNodePtr)xmlNewDocTextLen(pxVar15,in_RSI,iVar6);
        desret_xmlNodePtr(pxVar12);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_44);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar1 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewDocTextLen",(ulong)(uint)(iVar6 - iVar1));
          local_90 = local_90 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",(ulong)uVar10);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 4) {
    for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar1 = (int)pxVar27;
          if (iVar1 == 5) break;
          iVar5 = xmlMemBlocks();
          pxVar15 = gen_xmlDocPtr(iVar6,iVar2);
          in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar2);
          gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar12 = (xmlNodePtr)xmlNewDtd(pxVar15,in_RSI,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_45);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewDtd",(ulong)(uint)(iVar2 - iVar5));
            local_74 = local_74 + 1;
            printf(" %d",uVar20);
            printf(" %d",iVar7);
            printf(" %d",(ulong)uVar37);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
        }
      }
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  local_b0 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      pxVar26 = gen_xmlNsPtr(uVar37,iVar6);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar6);
      pxVar12 = (xmlNodePtr)xmlNewNode(pxVar26);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      if (uVar37 == 0) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNode",(ulong)(uint)(iVar6 - iVar1));
        local_b0 = local_b0 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_19 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 2) break;
      iVar1 = xmlMemBlocks();
      pxVar26 = gen_xmlNsPtr(uVar37,iVar6);
      in_RSI = (xmlDocPtr)gen_eaten_name(iVar7,iVar6);
      pxVar12 = (xmlNodePtr)xmlNewNodeEatName(pxVar26);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      if (uVar37 == 0) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewNodeEatName",(ulong)(uint)(iVar6 - iVar1));
        test_ret_19 = test_ret_19 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 5) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(iVar6,iVar7);
        pxVar28 = gen_const_xmlChar_ptr(iVar1,iVar7);
        auVar39 = xmlNewNs(in_RSI,pxVar17,pxVar28);
        lVar18 = auVar39._0_8_;
        iVar7 = (int)CONCAT71(auVar39._9_7_,lVar18 != 0 && in_RSI == (xmlDocPtr)0x0);
        if (lVar18 != 0 && in_RSI == (xmlDocPtr)0x0) {
          xmlFreeNs(lVar18);
          iVar7 = extraout_EDX_09;
        }
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,iVar7);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewNs",(ulong)(uint)(iVar7 - iVar2));
          local_94 = local_94 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 2) {
      for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
        for (uVar10 = 0; iVar1 = (int)in_RSI, uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar2 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
          pxVar26 = gen_xmlNsPtr(iVar6,iVar1);
          pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar1);
          gen_const_xmlChar_ptr(uVar10,iVar1);
          pxVar16 = (xmlAttrPtr)xmlNewNsProp(in_RSI,pxVar26,pxVar17);
          desret_xmlAttrPtr(pxVar16);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_46);
          if (iVar6 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsProp",(ulong)(uint)(iVar1 - iVar2));
            local_78 = local_78 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",uVar20);
            printf(" %d",iVar7);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 2) {
      for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
        for (uVar10 = 0; iVar1 = (int)in_RSI, uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar2 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
          pxVar26 = gen_xmlNsPtr(iVar6,iVar1);
          pxVar17 = gen_eaten_name(iVar7,iVar1);
          gen_const_xmlChar_ptr(uVar10,iVar1);
          pxVar16 = (xmlAttrPtr)xmlNewNsPropEatName(in_RSI,pxVar26,pxVar17);
          desret_xmlAttrPtr(pxVar16);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_47);
          if (iVar6 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewNsPropEatName",(ulong)(uint)(iVar1 - iVar2));
            local_7c = local_7c + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",uVar20);
            printf(" %d",iVar7);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_20 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar6);
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar7,iVar6);
      pxVar12 = (xmlNodePtr)xmlNewPI(pxVar17);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewPI",(ulong)(uint)(iVar6 - iVar1));
        test_ret_20 = test_ret_20 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_7 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 5) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(iVar6,iVar7);
        pxVar28 = gen_const_xmlChar_ptr(iVar1,iVar7);
        pxVar16 = (xmlAttrPtr)xmlNewProp(in_RSI,pxVar17,pxVar28);
        desret_xmlAttrPtr(pxVar16);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_48);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNewProp",(ulong)(uint)(iVar7 - iVar2));
          test_ret_7 = test_ret_7 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  local_40 = 0;
  while (bVar32) {
    for (uVar37 = 0; iVar6 = (int)in_RSI, uVar37 != 5; uVar37 = uVar37 + 1) {
      iVar7 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(uVar37,iVar6);
      pxVar12 = (xmlNodePtr)xmlNewReference(0);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar7 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewReference",(ulong)(uint)(iVar6 - iVar7));
        local_40 = local_40 + 1;
        printf(" %d",0);
        in_RSI = (xmlDocPtr)(ulong)uVar37;
        printf(" %d");
        putchar(10);
      }
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  test_ret_21 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    pxVar17 = gen_const_xmlChar_ptr(uVar37,(int)in_RSI);
    pxVar12 = (xmlNodePtr)xmlNewText(pxVar17);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNewText",(ulong)(uint)(iVar7 - iVar6));
      test_ret_21 = test_ret_21 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 2) {
      for (iVar7 = 0; iVar7 != 5; iVar7 = iVar7 + 1) {
        for (uVar10 = 0; iVar1 = (int)in_RSI, uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar2 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar1);
          pxVar26 = gen_xmlNsPtr(iVar6,iVar1);
          pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar1);
          gen_const_xmlChar_ptr(uVar10,iVar1);
          pxVar12 = (xmlNodePtr)xmlNewTextChild(in_RSI,pxVar26,pxVar17);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_49);
          if (iVar6 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlNewTextChild",(ulong)(uint)(iVar1 - iVar2));
            test_ret_5 = test_ret_5 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",uVar20);
            printf(" %d",iVar7);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_44 = 0;
  for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 4) break;
      iVar1 = xmlMemBlocks();
      pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar6);
      uVar10 = gen_int(iVar7,iVar6);
      if ((pxVar17 != (xmlChar *)0x0) && (iVar6 = xmlStrlen(pxVar17), iVar6 < (int)uVar10)) {
        uVar10 = 0;
      }
      in_RSI = (xmlDocPtr)(ulong)uVar10;
      pxVar12 = (xmlNodePtr)xmlNewTextLen(pxVar17);
      desret_xmlNodePtr(pxVar12);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNewTextLen",(ulong)(uint)(iVar6 - iVar1));
        local_44 = local_44 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_34 = 0;
  for (uVar37 = 0; iVar6 = (int)in_RSI, uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar7 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
    pxVar12 = (xmlNodePtr)xmlNextElementSibling(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_50);
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar7 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlNextElementSibling",(ulong)(uint)(iVar6 - iVar7));
      local_34 = local_34 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_22 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar6);
      xmlNodeAddContent(in_RSI,pxVar17);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_51);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeAddContent",(ulong)(uint)(iVar6 - iVar1));
        test_ret_22 = test_ret_22 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 3) {
    for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 4) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar7);
        iVar7 = gen_int(iVar1,iVar7);
        if ((pxVar17 != (xmlChar *)0x0) && (iVar5 = xmlStrlen(pxVar17), iVar5 < iVar7)) {
          iVar7 = 0;
        }
        xmlNodeAddContentLen(in_RSI,pxVar17,iVar7);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_52);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeAddContentLen",(ulong)(uint)(iVar7 - iVar2));
          local_9c = local_9c + 1;
          printf(" %d",uVar20);
          printf(" %d",(ulong)uVar37);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  test_ret_23 = 0;
  for (iVar6 = 0; iVar6 != 3; iVar6 = iVar6 + 1) {
    bVar32 = true;
    while (iVar7 = (int)in_RSI, bVar32) {
      iVar1 = xmlMemBlocks();
      pxVar14 = gen_xmlBufferPtr(iVar6,iVar7);
      in_RSI = (xmlDocPtr)0x0;
      xmlNodeBufGetContent();
      call_tests = call_tests + 1;
      if (pxVar14 != (xmlBufferPtr)0x0) {
        xmlBufferFree();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar1 == iVar7) break;
      iVar7 = xmlMemBlocks();
      bVar32 = false;
      printf("Leak of %d blocks found in xmlNodeBufGetContent",(ulong)(uint)(iVar7 - iVar1));
      test_ret_23 = test_ret_23 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      uVar20 = 0;
      while (iVar6 = (int)uVar20, iVar6 != 3) {
        for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
          pxVar27 = (xmlDocPtr)0x0;
          while( true ) {
            iVar2 = (int)in_RSI;
            iVar1 = (int)pxVar27;
            if (iVar1 == 4) break;
            iVar5 = xmlMemBlocks();
            pxVar14 = gen_xmlBufferPtr(uVar37,iVar2);
            pxVar21 = gen_xmlDocPtr(uVar10,iVar2);
            in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar2);
            iVar8 = gen_int(iVar7,iVar2);
            iVar2 = gen_int(iVar1,iVar2);
            pxVar15 = pxVar21;
            xmlNodeDump(pxVar14,pxVar21,in_RSI,iVar8,iVar2);
            call_tests = call_tests + 1;
            iVar2 = extraout_EDX_10;
            if (pxVar14 != (xmlBufferPtr)0x0) {
              xmlBufferFree(pxVar14);
              iVar2 = extraout_EDX_11;
            }
            des_xmlDocPtr((int)pxVar21,pxVar15,iVar2);
            des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_53);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar5 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlNodeDump",(ulong)(uint)(iVar2 - iVar5));
              local_60 = local_60 + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",(ulong)uVar10);
              printf(" %d",uVar20);
              printf(" %d",iVar7);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar27;
            }
            pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
          }
        }
        uVar20 = (ulong)(iVar6 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_8 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      for (iVar7 = 0; iVar7 != 3; iVar7 = iVar7 + 1) {
        for (iVar1 = 0; iVar1 != 4; iVar1 = iVar1 + 1) {
          for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
            pxVar27 = (xmlDocPtr)0x0;
            _test_ret = &DAT_0015bd68;
            while( true ) {
              iVar5 = (int)in_RSI;
              uVar10 = (uint)pxVar27;
              if (uVar10 == 4) break;
              iVar8 = xmlMemBlocks();
              pxVar29 = gen_xmlOutputBufferPtr(uVar37,iVar5);
              pxVar15 = gen_xmlDocPtr(iVar6,iVar5);
              in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar5);
              iVar4 = gen_int(iVar1,iVar5);
              iVar5 = gen_int(iVar2,iVar5);
              if (uVar10 < 3) {
                uVar19 = *_test_ret;
              }
              else {
                uVar19 = 0;
              }
              pxVar21 = pxVar15;
              xmlNodeDumpOutput(pxVar29,pxVar15,in_RSI,iVar4,iVar5,uVar19);
              call_tests = call_tests + 1;
              iVar5 = extraout_EDX_12;
              if (pxVar29 != (xmlOutputBufferPtr)0x0) {
                xmlOutputBufferClose(pxVar29);
                iVar5 = extraout_EDX_13;
              }
              des_xmlDocPtr((int)pxVar15,pxVar21,iVar5);
              des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_54);
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar8 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlNodeDumpOutput",(ulong)(uint)(iVar5 - iVar8));
                test_ret_8 = test_ret_8 + 1;
                printf(" %d",(ulong)uVar37);
                printf(" %d",iVar6);
                printf(" %d",iVar7);
                printf(" %d",iVar1);
                printf(" %d",iVar2);
                printf(" %d");
                putchar(10);
                in_RSI = pxVar27;
              }
              pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
              _test_ret = _test_ret + 1;
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  iVar7 = 1;
  while (iVar7 != 0) {
    uVar20 = 0;
    while( true ) {
      iVar7 = 0;
      iVar1 = (int)uVar20;
      if (iVar1 == 5) break;
      for (; iVar7 != 5; iVar7 = iVar7 + 1) {
        bVar32 = true;
        while (iVar2 = (int)in_RSI, bVar32) {
          iVar5 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar2);
          xmlNodeGetAttrValue(0,in_RSI,pxVar17,0);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 == iVar2) break;
          iVar2 = xmlMemBlocks();
          bVar32 = false;
          printf("Leak of %d blocks found in xmlNodeGetAttrValue",(ulong)(uint)(iVar2 - iVar5));
          iVar6 = iVar6 + 1;
          printf(" %d",0);
          printf(" %d",uVar20);
          printf(" %d");
          in_RSI = (xmlDocPtr)0x0;
          printf(" %d");
          putchar(10);
        }
      }
      uVar20 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  bVar32 = true;
  while (bVar32) {
    bVar32 = true;
    while (bVar32) {
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)0x0;
      lVar18 = xmlNodeGetBase();
      if (lVar18 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 == iVar2) break;
      xmlMemBlocks();
      bVar32 = false;
      printf("Leak of %d blocks found in xmlNodeGetBase");
      iVar7 = iVar7 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  bVar32 = true;
  while (bVar32) {
    bVar32 = true;
LAB_00130e59:
    if (bVar32) {
      bVar32 = true;
      while (bVar32) {
        iVar2 = xmlMemBlocks();
        bVar32 = false;
        in_RSI = (xmlDocPtr)0x0;
        xmlNodeGetBaseSafe(0,0,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 == iVar5) goto LAB_00130e59;
        xmlMemBlocks();
        bVar32 = false;
        printf("Leak of %d blocks found in xmlNodeGetBaseSafe");
        iVar1 = iVar1 + 1;
        printf(" %d");
        printf(" %d");
        in_RSI = (xmlDocPtr)0x0;
        printf(" %d");
        putchar(10);
      }
      bVar32 = false;
      goto LAB_00130e59;
    }
    bVar32 = false;
  }
  function_tests = function_tests + 1;
  local_d0 = local_d0 -
             (test_ret_22 + local_9c + test_ret_23 + local_60 + test_ret_8 + iVar6 + iVar7 + iVar1 +
             test_ret_20 + test_ret_7 + local_40 + test_ret_21 + test_ret_5 + local_44 + local_34 +
             local_74 + local_b0 + test_ret_19 + local_94 + local_78 + local_7c +
             test_ret_6 + local_8c + local_70 + test_ret_18 + local_90 +
             local_a8 + test_ret_17 + local_68 + local_6c +
             local_64 + local_54 + local_58 + test_ret_26 + test_ret_16 + local_a0 + test_ret_15);
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    lVar18 = xmlNodeGetContent(0);
    if (lVar18 != 0) {
      (*_xmlFree)(lVar18);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlNodeGetContent");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    lVar18 = xmlNodeGetLang(0);
    if (lVar18 != 0) {
      (*_xmlFree)(lVar18);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlNodeGetLang");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlNodeGetSpacePreserve(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlNodeGetSpacePreserve");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  bVar32 = true;
  while (bVar32) {
    iVar6 = xmlMemBlocks();
    xmlNodeIsText(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 == iVar7) break;
    xmlMemBlocks();
    bVar32 = false;
    printf("Leak of %d blocks found in xmlNodeIsText");
    in_RSI = (xmlDocPtr)0x0;
    printf(" %d");
    putchar(10);
    local_d0 = local_d0 + -1;
  }
  function_tests = function_tests + 1;
  pxVar27 = (xmlDocPtr)0x1;
  test_ret_8 = 0;
  while (pxVar27 != (xmlDocPtr)0x0) {
    bVar32 = true;
    while (pxVar27 = (xmlDocPtr)0x0, bVar32) {
      while( true ) {
        iVar6 = (int)in_RSI;
        iVar7 = (int)pxVar27;
        if (iVar7 == 4) break;
        iVar1 = xmlMemBlocks();
        iVar6 = gen_int(iVar7,iVar6);
        in_RSI = (xmlDocPtr)0x0;
        lVar18 = xmlNodeListGetRawString(0,0,iVar6);
        if (lVar18 != 0) {
          (*_xmlFree)();
        }
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar1 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeListGetRawString",(ulong)(uint)(iVar6 - iVar1));
          test_ret_8 = test_ret_8 + 1;
          printf(" %d",0);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
      }
      bVar32 = false;
    }
  }
  function_tests = function_tests + 1;
  local_60 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    bVar32 = true;
    while (bVar32) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar6 = (int)in_RSI;
        iVar7 = (int)pxVar27;
        if (iVar7 == 4) break;
        iVar1 = xmlMemBlocks();
        pxVar15 = gen_xmlDocPtr(uVar37,iVar6);
        iVar6 = gen_int(iVar7,iVar6);
        in_RSI = (xmlDocPtr)0x0;
        auVar38 = xmlNodeListGetString(pxVar15,0,iVar6);
        iVar6 = auVar38._8_4_;
        if (auVar38._0_8_ != 0) {
          (*_xmlFree)(auVar38._0_8_);
          iVar6 = extraout_EDX_14;
        }
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,iVar6);
        xmlResetLastError();
        iVar6 = xmlMemBlocks();
        if (iVar1 != iVar6) {
          iVar6 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeListGetString",(ulong)(uint)(iVar6 - iVar1));
          local_60 = local_60 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",0);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
      }
      bVar32 = false;
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar6);
      xmlNodeSetBase(in_RSI,pxVar17);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_55);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetBase",(ulong)(uint)(iVar6 - iVar1));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_26 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar6);
      xmlNodeSetContent(in_RSI,pxVar17);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_56);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetContent",(ulong)(uint)(iVar6 - iVar1));
        test_ret_26 = test_ret_26 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_64 = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 3) {
    for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 4) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar6,iVar7);
        pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar7);
        iVar7 = gen_int(iVar1,iVar7);
        if ((pxVar17 != (xmlChar *)0x0) && (iVar5 = xmlStrlen(pxVar17), iVar5 < iVar7)) {
          iVar7 = 0;
        }
        xmlNodeSetContentLen(in_RSI,pxVar17,iVar7);
        call_tests = call_tests + 1;
        des_xmlNodePtr(iVar6,(xmlNodePtr)in_RSI,nr_57);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlNodeSetContentLen",(ulong)(uint)(iVar7 - iVar2));
          local_64 = local_64 + 1;
          printf(" %d",uVar20);
          printf(" %d",(ulong)uVar37);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  test_ret_6 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar6);
      xmlNodeSetLang(in_RSI,pxVar17);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_58);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetLang",(ulong)(uint)(iVar6 - iVar1));
        test_ret_6 = test_ret_6 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_8c = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 5) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      pxVar17 = gen_const_xmlChar_ptr(iVar7,iVar6);
      xmlNodeSetName(in_RSI,pxVar17);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_59);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetName",(ulong)(uint)(iVar6 - iVar1));
        local_8c = local_8c + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_90 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 4) break;
      iVar1 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
      iVar6 = gen_int(iVar7,iVar6);
      xmlNodeSetSpacePreserve(in_RSI,iVar6);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_60);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlNodeSetSpacePreserve",(ulong)(uint)(iVar6 - iVar1));
        local_90 = local_90 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_22 = 0;
  for (uVar37 = 0; iVar6 = (int)in_RSI, uVar37 != 3; uVar37 = uVar37 + 1) {
    iVar7 = xmlMemBlocks();
    in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar6);
    pxVar12 = (xmlNodePtr)xmlPreviousElementSibling(in_RSI);
    desret_xmlNodePtr(pxVar12);
    call_tests = call_tests + 1;
    des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_61);
    xmlResetLastError();
    iVar6 = xmlMemBlocks();
    if (iVar7 != iVar6) {
      iVar6 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPreviousElementSibling",(ulong)(uint)(iVar6 - iVar7));
      test_ret_22 = test_ret_22 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_94 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 3) break;
      iVar1 = xmlMemBlocks();
      pxVar21 = gen_xmlDocPtr(uVar37,iVar6);
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar6);
      pxVar15 = in_RSI;
      xmlReconciliateNs(pxVar21);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar21,pxVar15,nr_62);
      des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_63);
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReconciliateNs",(ulong)(uint)(iVar6 - iVar1));
        local_94 = local_94 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_23 = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    iVar6 = xmlMemBlocks();
    gen_xmlAttrPtr(uVar37,(int)in_RSI);
    xmlRemoveProp();
    call_tests = call_tests + 1;
    if (uVar37 == 0) {
      free_api_doc();
    }
    xmlResetLastError();
    iVar7 = xmlMemBlocks();
    if (iVar6 != iVar7) {
      iVar7 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlRemoveProp",(ulong)(uint)(iVar7 - iVar6));
      test_ret_23 = test_ret_23 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  test_ret_7 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar6 = (int)in_RSI;
      iVar7 = (int)pxVar27;
      if (iVar7 == 3) break;
      iVar1 = xmlMemBlocks();
      pxVar12 = gen_xmlNodePtr(uVar37,iVar6);
      pxVar15 = (xmlDocPtr)gen_xmlNodePtr_in(iVar7,iVar6);
      in_RSI = pxVar15;
      xmlReplaceNode();
      if (pxVar15 != (xmlDocPtr)0x0) {
        xmlUnlinkNode(pxVar15);
        xmlFreeNode();
      }
      if (pxVar12 != (xmlNodePtr)0x0) {
        xmlUnlinkNode(pxVar12);
        xmlFreeNode();
      }
      call_tests = call_tests + 1;
      if (uVar37 == 1) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar6 = xmlMemBlocks();
      if (iVar1 != iVar6) {
        iVar6 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlReplaceNode",(ulong)(uint)(iVar6 - iVar1));
        test_ret_7 = test_ret_7 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_9c = 0;
  uVar20 = 0;
  while (iVar6 = (int)uVar20, iVar6 != 6) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar1 = (int)pxVar27;
      if (iVar1 == 4) break;
      iVar2 = xmlMemBlocks();
      pcVar30 = gen_fileoutput(iVar6,iVar7);
      pxVar15 = gen_xmlDocPtr(iVar1,iVar7);
      in_RSI = pxVar15;
      xmlSaveFile(pcVar30);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_64);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar2 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSaveFile",(ulong)(uint)(iVar7 - iVar2));
        local_9c = local_9c + 1;
        printf(" %d",uVar20);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
    uVar20 = (ulong)(iVar6 + 1);
  }
  function_tests = function_tests + 1;
  local_68 = 0;
  for (uVar37 = 0; uVar37 != 6; uVar37 = uVar37 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      puVar35 = &DAT_0015bd68;
      while( true ) {
        iVar7 = (int)in_RSI;
        uVar10 = (uint)pxVar27;
        if (uVar10 == 4) break;
        iVar1 = xmlMemBlocks();
        pcVar30 = gen_fileoutput(uVar37,iVar7);
        pxVar15 = gen_xmlDocPtr(iVar6,iVar7);
        if (uVar10 < 3) {
          uVar19 = *puVar35;
        }
        else {
          uVar19 = 0;
        }
        in_RSI = pxVar15;
        xmlSaveFileEnc(pcVar30,pxVar15,uVar19);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_65);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar1 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileEnc",(ulong)(uint)(iVar7 - iVar1));
          local_68 = local_68 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",iVar6);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
        puVar35 = puVar35 + 1;
      }
    }
  }
  function_tests = function_tests + 1;
  local_6c = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
      pxVar27 = (xmlDocPtr)0x0;
      puVar35 = &DAT_0015bd68;
      while( true ) {
        iVar7 = (int)in_RSI;
        uVar10 = (uint)pxVar27;
        if (uVar10 == 4) break;
        iVar1 = xmlMemBlocks();
        pxVar29 = gen_xmlOutputBufferPtr(uVar37,iVar7);
        pxVar15 = gen_xmlDocPtr(iVar6,iVar7);
        if (uVar10 < 3) {
          uVar19 = *puVar35;
        }
        else {
          uVar19 = 0;
        }
        in_RSI = pxVar15;
        xmlSaveFileTo(pxVar29,pxVar15,uVar19);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_66);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar1 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFileTo",(ulong)(uint)(iVar7 - iVar1));
          local_6c = local_6c + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",iVar6);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(uVar10 + 1);
        puVar35 = puVar35 + 1;
      }
    }
  }
  function_tests = function_tests + 1;
  local_70 = 0;
  for (uVar37 = 0; uVar37 != 6; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar6 = (int)uVar20, iVar6 != 4) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar7 = (int)in_RSI;
        iVar1 = (int)pxVar27;
        if (iVar1 == 4) break;
        iVar2 = xmlMemBlocks();
        pcVar30 = gen_fileoutput(uVar37,iVar7);
        pxVar15 = gen_xmlDocPtr(iVar6,iVar7);
        iVar7 = gen_int(iVar1,iVar7);
        in_RSI = pxVar15;
        xmlSaveFormatFile(pcVar30,pxVar15,iVar7);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar15,in_RSI,nr_67);
        xmlResetLastError();
        iVar7 = xmlMemBlocks();
        if (iVar2 != iVar7) {
          iVar7 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSaveFormatFile",(ulong)(uint)(iVar7 - iVar2));
          local_70 = local_70 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
      }
      uVar20 = (ulong)(iVar6 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar6 = 0;
  for (uVar37 = 0; uVar37 != 6; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      uVar20 = 0;
      while (uVar11 = (uint)uVar20, uVar11 != 4) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar7 = (int)pxVar27;
          if (iVar7 == 4) break;
          iVar2 = xmlMemBlocks();
          pcVar30 = gen_fileoutput(uVar37,iVar1);
          pxVar15 = gen_xmlDocPtr(uVar10,iVar1);
          if (uVar11 < 3) {
            uVar19 = (&DAT_0015bd68)[uVar20];
          }
          else {
            uVar19 = 0;
          }
          iVar1 = gen_int(iVar7,iVar1);
          in_RSI = pxVar15;
          xmlSaveFormatFileEnc(pcVar30,pxVar15,uVar19,iVar1);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_68);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileEnc",(ulong)(uint)(iVar1 - iVar2));
            iVar6 = iVar6 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",(ulong)uVar10);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
        }
        uVar20 = (ulong)(uVar11 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_cc = 0;
  for (uVar37 = 0; uVar37 != 2; uVar37 = uVar37 + 1) {
    for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
      uVar20 = 0;
      while (uVar11 = (uint)uVar20, uVar11 != 4) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar7 = (int)pxVar27;
          if (iVar7 == 4) break;
          iVar2 = xmlMemBlocks();
          pxVar29 = gen_xmlOutputBufferPtr(uVar37,iVar1);
          pxVar15 = gen_xmlDocPtr(uVar10,iVar1);
          if (uVar11 < 3) {
            uVar19 = (&DAT_0015bd68)[uVar20];
          }
          else {
            uVar19 = 0;
          }
          iVar1 = gen_int(iVar7,iVar1);
          in_RSI = pxVar15;
          xmlSaveFormatFileTo(pxVar29,pxVar15,uVar19,iVar1);
          call_tests = call_tests + 1;
          des_xmlDocPtr((int)pxVar15,in_RSI,nr_69);
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar2 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSaveFormatFileTo",(ulong)(uint)(iVar1 - iVar2));
            local_cc = local_cc + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",(ulong)uVar10);
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar7 + 1);
        }
        uVar20 = (ulong)(uVar11 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_74 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 3) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar1 = (int)in_RSI;
        iVar2 = (int)pxVar27;
        if (iVar2 == 5) break;
        iVar5 = xmlMemBlocks();
        pxVar21 = gen_xmlDocPtr(uVar37,iVar1);
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar1);
        pxVar17 = gen_const_xmlChar_ptr(iVar2,iVar1);
        pxVar15 = in_RSI;
        xmlSearchNs(pxVar21,in_RSI,pxVar17);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar21,pxVar15,nr_70);
        des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_71);
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar5 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNs",(ulong)(uint)(iVar1 - iVar5));
          local_74 = local_74 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar2 + 1);
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_78 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 3) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar1 = (int)in_RSI;
        iVar2 = (int)pxVar27;
        if (iVar2 == 5) break;
        iVar5 = xmlMemBlocks();
        pxVar21 = gen_xmlDocPtr(uVar37,iVar1);
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(iVar7,iVar1);
        pxVar17 = gen_const_xmlChar_ptr(iVar2,iVar1);
        pxVar15 = in_RSI;
        xmlSearchNsByHref(pxVar21,in_RSI,pxVar17);
        call_tests = call_tests + 1;
        des_xmlDocPtr((int)pxVar21,pxVar15,nr_72);
        des_xmlNodePtr(iVar7,(xmlNodePtr)in_RSI,nr_73);
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar5 != iVar1) {
          iVar1 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSearchNsByHref",(ulong)(uint)(iVar1 - iVar5));
          local_78 = local_78 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar2 + 1);
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar37 = 0xffffffff;
  test_ret_15 = 0;
  while (uVar37 != 3) {
    iVar7 = xmlMemBlocks();
    uVar37 = uVar37 + 1;
    xmlSetBufferAllocationScheme();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar7 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetBufferAllocationScheme",(ulong)(uint)(iVar1 - iVar7))
      ;
      test_ret_15 = test_ret_15 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_54 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    iVar7 = xmlMemBlocks();
    gen_int(uVar37,(int)in_RSI);
    xmlSetCompressMode();
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar1 = xmlMemBlocks();
    if (iVar7 != iVar1) {
      iVar1 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlSetCompressMode",(ulong)(uint)(iVar1 - iVar7));
      local_54 = local_54 + 1;
      in_RSI = (xmlDocPtr)(ulong)uVar37;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_a0 = 0;
  for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar1 = (int)pxVar27;
      if (iVar1 == 4) break;
      iVar2 = xmlMemBlocks();
      pxVar15 = gen_xmlDocPtr(uVar37,iVar7);
      uVar10 = gen_int(iVar1,iVar7);
      in_RSI = (xmlDocPtr)(ulong)uVar10;
      xmlSetDocCompressMode(pxVar15);
      call_tests = call_tests + 1;
      des_xmlDocPtr((int)pxVar15,in_RSI,nr_74);
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar2 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetDocCompressMode",(ulong)(uint)(iVar7 - iVar2));
        local_a0 = local_a0 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_16 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    pxVar27 = (xmlDocPtr)0x0;
    while( true ) {
      iVar7 = (int)in_RSI;
      iVar1 = (int)pxVar27;
      if (iVar1 == 2) break;
      iVar2 = xmlMemBlocks();
      in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar7);
      pxVar26 = gen_xmlNsPtr(iVar1,iVar7);
      xmlSetNs(in_RSI,pxVar26);
      call_tests = call_tests + 1;
      des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_75);
      if (iVar1 == 0) {
        free_api_doc();
      }
      xmlResetLastError();
      iVar7 = xmlMemBlocks();
      if (iVar2 != iVar7) {
        iVar7 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlSetNs",(ulong)(uint)(iVar7 - iVar2));
        test_ret_16 = test_ret_16 + 1;
        printf(" %d",(ulong)uVar37);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar27;
      }
      pxVar27 = (xmlDocPtr)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_c8 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar7 = (int)uVar20, iVar7 != 2) {
      for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
        for (uVar10 = 0; iVar2 = (int)in_RSI, uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar5 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
          pxVar26 = gen_xmlNsPtr(iVar7,iVar2);
          pxVar17 = gen_const_xmlChar_ptr(iVar1,iVar2);
          pxVar28 = gen_const_xmlChar_ptr(uVar10,iVar2);
          pxVar16 = (xmlAttrPtr)xmlSetNsProp(in_RSI,pxVar26,pxVar17,pxVar28);
          desret_xmlAttrPtr(pxVar16);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_76);
          if (iVar7 == 0) {
            free_api_doc();
          }
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSetNsProp",(ulong)(uint)(iVar2 - iVar5));
            local_c8 = local_c8 + 1;
            printf(" %d",(ulong)uVar37);
            printf(" %d",uVar20);
            printf(" %d",iVar1);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      uVar20 = (ulong)(iVar7 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar7 = 0;
  for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
    uVar20 = 0;
    while (iVar1 = (int)uVar20, iVar1 != 5) {
      pxVar27 = (xmlDocPtr)0x0;
      while( true ) {
        iVar2 = (int)in_RSI;
        iVar5 = (int)pxVar27;
        if (iVar5 == 5) break;
        iVar8 = xmlMemBlocks();
        in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
        pxVar17 = gen_const_xmlChar_ptr(iVar1,iVar2);
        pxVar28 = gen_const_xmlChar_ptr(iVar5,iVar2);
        pxVar16 = (xmlAttrPtr)xmlSetProp(in_RSI,pxVar17,pxVar28);
        desret_xmlAttrPtr(pxVar16);
        call_tests = call_tests + 1;
        des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_77);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar8 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlSetProp",(ulong)(uint)(iVar2 - iVar8));
          iVar7 = iVar7 + 1;
          printf(" %d",(ulong)uVar37);
          printf(" %d",uVar20);
          printf(" %d");
          putchar(10);
          in_RSI = pxVar27;
        }
        pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
      }
      uVar20 = (ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  local_44 = 0;
  do {
    if (iVar1 == 5) {
      function_tests = function_tests + 1;
      local_a8 = 0;
      uVar20 = 0;
      while (iVar1 = (int)uVar20, iVar1 != 5) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar2 = (int)in_RSI;
          iVar5 = (int)pxVar27;
          if (iVar5 == 2) break;
          iVar8 = xmlMemBlocks();
          gen_const_xmlChar_ptr(iVar1,iVar2);
          in_RSI = (xmlDocPtr)0x0;
          if (iVar5 == 0) {
            in_RSI = (xmlDocPtr)(inttab + 1);
          }
          xmlSplitQName3();
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar8 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSplitQName3",(ulong)(uint)(iVar2 - iVar8));
            local_a8 = local_a8 + 1;
            printf(" %d",uVar20);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
        }
        uVar20 = (ulong)(iVar1 + 1);
      }
      function_tests = function_tests + 1;
      bVar32 = true;
      test_ret_18 = 0;
      while (bVar32) {
        pxVar27 = (xmlDocPtr)0x0;
        while( true ) {
          iVar1 = (int)in_RSI;
          iVar2 = (int)pxVar27;
          if (iVar2 == 5) break;
          iVar5 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar1);
          pxVar12 = (xmlNodePtr)xmlStringGetNodeList(0);
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar1 = xmlMemBlocks();
          if (iVar5 != iVar1) {
            iVar1 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlStringGetNodeList",(ulong)(uint)(iVar1 - iVar5));
            test_ret_18 = test_ret_18 + 1;
            printf(" %d",0);
            printf(" %d");
            putchar(10);
            in_RSI = pxVar27;
          }
          pxVar27 = (xmlDocPtr)(ulong)(iVar2 + 1);
        }
        bVar32 = false;
      }
      function_tests = function_tests + 1;
      pxVar27 = (xmlDocPtr)0x1;
      iVar1 = 0;
      while (pxVar27 != (xmlDocPtr)0x0) {
        uVar20 = 0;
        while( true ) {
          pxVar27 = (xmlDocPtr)0x0;
          iVar2 = (int)uVar20;
          if (iVar2 == 5) break;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar8 = (int)pxVar27;
            if (iVar8 == 4) break;
            iVar4 = xmlMemBlocks();
            in_RSI = (xmlDocPtr)gen_const_xmlChar_ptr(iVar2,iVar5);
            iVar5 = gen_int(iVar8,iVar5);
            if ((in_RSI != (xmlDocPtr)0x0) && (iVar3 = xmlStrlen(in_RSI), iVar3 < iVar5)) {
              iVar5 = 0;
            }
            pxVar12 = (xmlNodePtr)xmlStringLenGetNodeList(0,in_RSI,iVar5);
            desret_xmlNodePtr(pxVar12);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlStringLenGetNodeList",
                     (ulong)(uint)(iVar5 - iVar4));
              iVar1 = iVar1 + 1;
              printf(" %d",0);
              printf(" %d",uVar20);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar27;
            }
            pxVar27 = (xmlDocPtr)(ulong)(iVar8 + 1);
          }
          uVar20 = (ulong)(iVar2 + 1);
        }
      }
      function_tests = function_tests + 1;
      local_7c = 0;
      for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
          pxVar27 = (xmlDocPtr)0x0;
          while( true ) {
            iVar2 = (int)in_RSI;
            iVar5 = (int)pxVar27;
            if (iVar5 == 4) break;
            iVar8 = xmlMemBlocks();
            in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar2);
            pxVar17 = gen_const_xmlChar_ptr(uVar10,iVar2);
            iVar2 = gen_int(iVar5,iVar2);
            if ((pxVar17 != (xmlChar *)0x0) && (iVar4 = xmlStrlen(pxVar17), iVar4 < iVar2)) {
              iVar2 = 0;
            }
            xmlTextConcat(in_RSI,pxVar17,iVar2);
            call_tests = call_tests + 1;
            des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_78);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar8 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextConcat",(ulong)(uint)(iVar2 - iVar8));
              local_7c = local_7c + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",(ulong)uVar10);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar27;
            }
            pxVar27 = (xmlDocPtr)(ulong)(iVar5 + 1);
          }
        }
      }
      function_tests = function_tests + 1;
      local_b0 = 0;
      for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar2 = (int)in_RSI, uVar10 != 3; uVar10 = uVar10 + 1) {
          iVar5 = xmlMemBlocks();
          pxVar13 = gen_xmlNodePtr_in(uVar37,iVar2);
          pxVar27 = (xmlDocPtr)gen_xmlNodePtr_in(uVar10,iVar2);
          in_RSI = pxVar27;
          pxVar12 = (xmlNodePtr)xmlTextMerge(pxVar13);
          if (pxVar12 == (xmlNodePtr)0x0) {
            xmlUnlinkNode(pxVar27);
            xmlFreeNode(pxVar27);
            pxVar12 = pxVar13;
          }
          desret_xmlNodePtr(pxVar12);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar5 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlTextMerge",(ulong)(uint)(iVar2 - iVar5));
            local_b0 = local_b0 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      uVar37 = 0xffffffff;
      local_58 = 0;
      while (uVar37 != 3) {
        iVar2 = xmlMemBlocks();
        uVar33 = 0;
        if (uVar37 < 3) {
          uVar33 = *(undefined4 *)(&DAT_0014b080 + (ulong)uVar37 * 4);
        }
        uVar37 = uVar37 + 1;
        xmlThrDefBufferAllocScheme(uVar33);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlThrDefBufferAllocScheme",
                 (ulong)(uint)(iVar5 - iVar2));
          local_58 = local_58 + 1;
          in_RSI = (xmlDocPtr)(ulong)uVar37;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      test_ret_17 = 0;
      for (uVar37 = 0; uVar37 != 4; uVar37 = uVar37 + 1) {
        iVar2 = xmlMemBlocks();
        iVar5 = gen_int(uVar37,(int)in_RSI);
        xmlThrDefDefaultBufferSize(iVar5);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar5 = xmlMemBlocks();
        if (iVar2 != iVar5) {
          iVar5 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlThrDefDefaultBufferSize",
                 (ulong)(uint)(iVar5 - iVar2));
          test_ret_17 = test_ret_17 + 1;
          in_RSI = (xmlDocPtr)(ulong)uVar37;
          printf(" %d");
          putchar(10);
        }
      }
      function_tests = function_tests + 1;
      iVar2 = 0;
      for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; uVar10 != 2; uVar10 = uVar10 + 1) {
          pxVar27 = (xmlDocPtr)0x0;
          while( true ) {
            iVar5 = (int)in_RSI;
            iVar8 = (int)pxVar27;
            if (iVar8 == 5) break;
            iVar4 = xmlMemBlocks();
            in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar5);
            pxVar26 = gen_xmlNsPtr(uVar10,iVar5);
            pxVar17 = gen_const_xmlChar_ptr(iVar8,iVar5);
            xmlUnsetNsProp(in_RSI,pxVar26,pxVar17);
            call_tests = call_tests + 1;
            des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_79);
            if (uVar10 == 0) {
              free_api_doc();
            }
            xmlResetLastError();
            iVar5 = xmlMemBlocks();
            if (iVar4 != iVar5) {
              iVar5 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlUnsetNsProp",(ulong)(uint)(iVar5 - iVar4));
              iVar2 = iVar2 + 1;
              printf(" %d",(ulong)uVar37);
              printf(" %d",(ulong)uVar10);
              printf(" %d");
              putchar(10);
              in_RSI = pxVar27;
            }
            pxVar27 = (xmlDocPtr)(ulong)(iVar8 + 1);
          }
        }
      }
      function_tests = function_tests + 1;
      test_ret_19 = 0;
      for (uVar37 = 0; uVar37 != 3; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar5 = (int)in_RSI, uVar10 != 5; uVar10 = uVar10 + 1) {
          iVar8 = xmlMemBlocks();
          in_RSI = (xmlDocPtr)gen_xmlNodePtr(uVar37,iVar5);
          pxVar17 = gen_const_xmlChar_ptr(uVar10,iVar5);
          xmlUnsetProp(in_RSI,pxVar17);
          call_tests = call_tests + 1;
          des_xmlNodePtr(uVar37,(xmlNodePtr)in_RSI,nr_80);
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar8 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlUnsetProp",(ulong)(uint)(iVar5 - iVar8));
            test_ret_19 = test_ret_19 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      test_ret_20 = 0;
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar5 = (int)in_RSI, uVar10 != 4; uVar10 = uVar10 + 1) {
          iVar8 = xmlMemBlocks();
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar5);
          uVar11 = gen_int(uVar10,iVar5);
          in_RSI = (xmlDocPtr)(ulong)uVar11;
          xmlValidateNCName(pxVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar5 = xmlMemBlocks();
          if (iVar8 != iVar5) {
            iVar5 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateNCName",(ulong)(uint)(iVar5 - iVar8));
            test_ret_20 = test_ret_20 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      iVar5 = 0;
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar8 = (int)in_RSI, uVar10 != 4; uVar10 = uVar10 + 1) {
          iVar4 = xmlMemBlocks();
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar8);
          uVar11 = gen_int(uVar10,iVar8);
          in_RSI = (xmlDocPtr)(ulong)uVar11;
          xmlValidateNMToken(pxVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar4 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateNMToken",(ulong)(uint)(iVar8 - iVar4));
            iVar5 = iVar5 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      local_40 = 0;
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar8 = (int)in_RSI, uVar10 != 4; uVar10 = uVar10 + 1) {
          iVar4 = xmlMemBlocks();
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar8);
          uVar11 = gen_int(uVar10,iVar8);
          in_RSI = (xmlDocPtr)(ulong)uVar11;
          xmlValidateName(pxVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar8 = xmlMemBlocks();
          if (iVar4 != iVar8) {
            iVar8 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateName",(ulong)(uint)(iVar8 - iVar4));
            local_40 = local_40 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      iVar8 = 0;
      for (uVar37 = 0; uVar37 != 5; uVar37 = uVar37 + 1) {
        for (uVar10 = 0; iVar4 = (int)in_RSI, uVar10 != 4; uVar10 = uVar10 + 1) {
          iVar3 = xmlMemBlocks();
          pxVar17 = gen_const_xmlChar_ptr(uVar37,iVar4);
          uVar11 = gen_int(uVar10,iVar4);
          in_RSI = (xmlDocPtr)(ulong)uVar11;
          xmlValidateQName(pxVar17);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar4 = xmlMemBlocks();
          if (iVar3 != iVar4) {
            iVar4 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidateQName",(ulong)(uint)(iVar4 - iVar3));
            iVar8 = iVar8 + 1;
            printf(" %d",(ulong)uVar37);
            in_RSI = (xmlDocPtr)(ulong)uVar10;
            printf(" %d");
            putchar(10);
          }
        }
      }
      function_tests = function_tests + 1;
      iVar6 = iVar5 + local_40 + iVar8 +
              iVar1 + local_7c + local_b0 + local_58 + test_ret_17 + iVar2 + test_ret_19 +
              test_ret_20 +
              local_a0 + test_ret_16 + local_c8 + iVar7 + local_44 + local_a8 + test_ret_18 +
              iVar6 + local_cc + local_74 + local_78 + test_ret_15 + local_54 +
              test_ret_7 + local_9c + local_68 + local_6c + local_70 +
              local_90 + test_ret_22 + local_94 + test_ret_23 +
              local_64 + test_ret_6 + local_8c + test_ret_5 + test_ret_26 + test_ret_8 + local_60;
      uVar37 = -(local_d0 - iVar6);
      if (local_d0 != iVar6) {
        printf("Module tree: %d errors\n",(ulong)uVar37);
      }
      return uVar37;
    }
    bVar32 = true;
    while (iVar2 = (int)in_RSI, bVar32) {
      iVar5 = xmlMemBlocks();
      gen_const_xmlChar_ptr(iVar1,iVar2);
      in_RSI = (xmlDocPtr)0x0;
      lVar18 = xmlSplitQName2();
      if (lVar18 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar5 == iVar2) break;
      iVar2 = xmlMemBlocks();
      bVar32 = false;
      printf("Leak of %d blocks found in xmlSplitQName2",(ulong)(uint)(iVar2 - iVar5));
      local_44 = local_44 + 1;
      printf(" %d");
      in_RSI = (xmlDocPtr)0x0;
      printf(" %d");
      putchar(10);
    }
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

static int
test_tree(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing tree : 146 of 172 functions ...\n");
    test_ret += test_xmlAddChild();
    test_ret += test_xmlAddChildList();
    test_ret += test_xmlAddNextSibling();
    test_ret += test_xmlAddPrevSibling();
    test_ret += test_xmlAddSibling();
    test_ret += test_xmlAttrSerializeTxtContent();
    test_ret += test_xmlBufContent();
    test_ret += test_xmlBufEnd();
    test_ret += test_xmlBufGetNodeContent();
    test_ret += test_xmlBufNodeDump();
    test_ret += test_xmlBufShrink();
    test_ret += test_xmlBufUse();
    test_ret += test_xmlBufferAdd();
    test_ret += test_xmlBufferAddHead();
    test_ret += test_xmlBufferCCat();
    test_ret += test_xmlBufferCat();
    test_ret += test_xmlBufferContent();
    test_ret += test_xmlBufferCreate();
    test_ret += test_xmlBufferCreateSize();
    test_ret += test_xmlBufferCreateStatic();
    test_ret += test_xmlBufferDetach();
    test_ret += test_xmlBufferEmpty();
    test_ret += test_xmlBufferGrow();
    test_ret += test_xmlBufferLength();
    test_ret += test_xmlBufferResize();
    test_ret += test_xmlBufferSetAllocationScheme();
    test_ret += test_xmlBufferShrink();
    test_ret += test_xmlBufferWriteCHAR();
    test_ret += test_xmlBufferWriteChar();
    test_ret += test_xmlBufferWriteQuotedString();
    test_ret += test_xmlBuildQName();
    test_ret += test_xmlChildElementCount();
    test_ret += test_xmlCopyDoc();
    test_ret += test_xmlCopyDtd();
    test_ret += test_xmlCopyNamespace();
    test_ret += test_xmlCopyNamespaceList();
    test_ret += test_xmlCopyNode();
    test_ret += test_xmlCopyNodeList();
    test_ret += test_xmlCopyProp();
    test_ret += test_xmlCopyPropList();
    test_ret += test_xmlCreateIntSubset();
    test_ret += test_xmlDOMWrapAdoptNode();
    test_ret += test_xmlDOMWrapCloneNode();
    test_ret += test_xmlDOMWrapNewCtxt();
    test_ret += test_xmlDOMWrapReconcileNamespaces();
    test_ret += test_xmlDOMWrapRemoveNode();
    test_ret += test_xmlDeregisterNodeDefault();
    test_ret += test_xmlDocCopyNode();
    test_ret += test_xmlDocCopyNodeList();
    test_ret += test_xmlDocDump();
    test_ret += test_xmlDocDumpFormatMemory();
    test_ret += test_xmlDocDumpFormatMemoryEnc();
    test_ret += test_xmlDocDumpMemory();
    test_ret += test_xmlDocDumpMemoryEnc();
    test_ret += test_xmlDocFormatDump();
    test_ret += test_xmlDocGetRootElement();
    test_ret += test_xmlDocSetRootElement();
    test_ret += test_xmlElemDump();
    test_ret += test_xmlFirstElementChild();
    test_ret += test_xmlGetBufferAllocationScheme();
    test_ret += test_xmlGetCompressMode();
    test_ret += test_xmlGetDocCompressMode();
    test_ret += test_xmlGetIntSubset();
    test_ret += test_xmlGetLastChild();
    test_ret += test_xmlGetLineNo();
    test_ret += test_xmlGetNoNsProp();
    test_ret += test_xmlGetNodePath();
    test_ret += test_xmlGetNsList();
    test_ret += test_xmlGetNsListSafe();
    test_ret += test_xmlGetNsProp();
    test_ret += test_xmlGetProp();
    test_ret += test_xmlHasNsProp();
    test_ret += test_xmlHasProp();
    test_ret += test_xmlIsBlankNode();
    test_ret += test_xmlIsXHTML();
    test_ret += test_xmlLastElementChild();
    test_ret += test_xmlNewCDataBlock();
    test_ret += test_xmlNewCharRef();
    test_ret += test_xmlNewChild();
    test_ret += test_xmlNewComment();
    test_ret += test_xmlNewDoc();
    test_ret += test_xmlNewDocComment();
    test_ret += test_xmlNewDocFragment();
    test_ret += test_xmlNewDocNode();
    test_ret += test_xmlNewDocNodeEatName();
    test_ret += test_xmlNewDocPI();
    test_ret += test_xmlNewDocProp();
    test_ret += test_xmlNewDocRawNode();
    test_ret += test_xmlNewDocText();
    test_ret += test_xmlNewDocTextLen();
    test_ret += test_xmlNewDtd();
    test_ret += test_xmlNewNode();
    test_ret += test_xmlNewNodeEatName();
    test_ret += test_xmlNewNs();
    test_ret += test_xmlNewNsProp();
    test_ret += test_xmlNewNsPropEatName();
    test_ret += test_xmlNewPI();
    test_ret += test_xmlNewProp();
    test_ret += test_xmlNewReference();
    test_ret += test_xmlNewText();
    test_ret += test_xmlNewTextChild();
    test_ret += test_xmlNewTextLen();
    test_ret += test_xmlNextElementSibling();
    test_ret += test_xmlNodeAddContent();
    test_ret += test_xmlNodeAddContentLen();
    test_ret += test_xmlNodeBufGetContent();
    test_ret += test_xmlNodeDump();
    test_ret += test_xmlNodeDumpOutput();
    test_ret += test_xmlNodeGetAttrValue();
    test_ret += test_xmlNodeGetBase();
    test_ret += test_xmlNodeGetBaseSafe();
    test_ret += test_xmlNodeGetContent();
    test_ret += test_xmlNodeGetLang();
    test_ret += test_xmlNodeGetSpacePreserve();
    test_ret += test_xmlNodeIsText();
    test_ret += test_xmlNodeListGetRawString();
    test_ret += test_xmlNodeListGetString();
    test_ret += test_xmlNodeSetBase();
    test_ret += test_xmlNodeSetContent();
    test_ret += test_xmlNodeSetContentLen();
    test_ret += test_xmlNodeSetLang();
    test_ret += test_xmlNodeSetName();
    test_ret += test_xmlNodeSetSpacePreserve();
    test_ret += test_xmlPreviousElementSibling();
    test_ret += test_xmlReconciliateNs();
    test_ret += test_xmlRegisterNodeDefault();
    test_ret += test_xmlRemoveProp();
    test_ret += test_xmlReplaceNode();
    test_ret += test_xmlSaveFile();
    test_ret += test_xmlSaveFileEnc();
    test_ret += test_xmlSaveFileTo();
    test_ret += test_xmlSaveFormatFile();
    test_ret += test_xmlSaveFormatFileEnc();
    test_ret += test_xmlSaveFormatFileTo();
    test_ret += test_xmlSearchNs();
    test_ret += test_xmlSearchNsByHref();
    test_ret += test_xmlSetBufferAllocationScheme();
    test_ret += test_xmlSetCompressMode();
    test_ret += test_xmlSetDocCompressMode();
    test_ret += test_xmlSetNs();
    test_ret += test_xmlSetNsProp();
    test_ret += test_xmlSetProp();
    test_ret += test_xmlSplitQName2();
    test_ret += test_xmlSplitQName3();
    test_ret += test_xmlStringGetNodeList();
    test_ret += test_xmlStringLenGetNodeList();
    test_ret += test_xmlTextConcat();
    test_ret += test_xmlTextMerge();
    test_ret += test_xmlThrDefBufferAllocScheme();
    test_ret += test_xmlThrDefDefaultBufferSize();
    test_ret += test_xmlThrDefDeregisterNodeDefault();
    test_ret += test_xmlThrDefRegisterNodeDefault();
    test_ret += test_xmlUnsetNsProp();
    test_ret += test_xmlUnsetProp();
    test_ret += test_xmlValidateNCName();
    test_ret += test_xmlValidateNMToken();
    test_ret += test_xmlValidateName();
    test_ret += test_xmlValidateQName();

    if (test_ret != 0)
	printf("Module tree: %d errors\n", test_ret);
    return(test_ret);
}